

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum.c
# Opt level: O0

void bn_mont_reduction_u32(uint32_t len,uint32_t *n,uint32_t nInv,uint32_t *c,uint32_t *res)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  undefined1 *puVar8;
  ulong uVar9;
  undefined8 uStack_1f0;
  undefined1 auStack_1e8 [8];
  undefined1 *local_1e0;
  uint32_t x;
  uint32_t *os;
  uint32_t i_4;
  uint32_t c2;
  uint32_t c10;
  uint32_t *res_i_3;
  uint32_t t2_1;
  uint32_t t1_1;
  uint32_t i_3;
  uint32_t *res_i_2;
  uint32_t t2;
  uint32_t t12;
  uint32_t *res_i2_1;
  uint32_t t22;
  uint32_t t11;
  uint32_t *res_i1_1;
  uint32_t t21;
  uint32_t t10;
  uint32_t *res_i0_1;
  uint32_t t20;
  uint32_t t1;
  uint32_t i_2;
  uint32_t c1;
  unsigned_long __vla_expr0;
  uint32_t local_148;
  uint local_144;
  uint32_t c00;
  uint32_t res_j;
  uint32_t *resb;
  uint32_t c10_1;
  uint32_t r;
  uint32_t *res_i_1;
  uint32_t a_i_1;
  uint32_t i_1;
  uint32_t *res_i;
  uint32_t *puStack_110;
  uint32_t a_i2;
  uint32_t *res_i2;
  uint32_t *puStack_100;
  uint32_t a_i1;
  uint32_t *res_i1;
  uint32_t *puStack_f0;
  uint32_t a_i0;
  uint32_t *res_i0;
  uint local_e0;
  uint32_t a_i;
  uint32_t i;
  uint32_t c1_1;
  uint32_t *res_j0;
  uint local_c8;
  uint32_t qj;
  uint32_t i0;
  uint32_t c0;
  uint32_t *res_local;
  uint32_t *c_local;
  uint32_t *puStack_a8;
  uint32_t nInv_local;
  uint32_t *n_local;
  uint32_t *puStack_98;
  uint32_t len_local;
  uint local_8c;
  uint32_t local_88;
  char local_81;
  
  qj = 0;
  _i0 = res;
  res_local = c;
  c_local._4_4_ = nInv;
  puStack_a8 = n;
  n_local._4_4_ = len;
  for (local_c8 = 0; local_c8 < n_local._4_4_; local_c8 = local_c8 + 1) {
    res_j0._4_4_ = c_local._4_4_ * res_local[local_c8];
    _i = res_local + local_c8;
    a_i = 0;
    for (local_e0 = 0; local_e0 < n_local._4_4_ >> 2; local_e0 = local_e0 + 1) {
      res_i0._4_4_ = puStack_a8[local_e0 << 2];
      puStack_f0 = _i + (local_e0 << 2);
      uStack_1f0 = 0x1de53e;
      a_i = Hacl_Bignum_Base_mul_wide_add2_u32(res_i0._4_4_,res_j0._4_4_,a_i,puStack_f0);
      res_i1._4_4_ = puStack_a8[local_e0 * 4 + 1];
      puStack_100 = _i + (ulong)(local_e0 << 2) + 1;
      uStack_1f0 = 0x1de5a4;
      a_i = Hacl_Bignum_Base_mul_wide_add2_u32(res_i1._4_4_,res_j0._4_4_,a_i,puStack_100);
      res_i2._4_4_ = puStack_a8[local_e0 * 4 + 2];
      puStack_110 = _i + (ulong)(local_e0 << 2) + 2;
      uStack_1f0 = 0x1de60a;
      a_i = Hacl_Bignum_Base_mul_wide_add2_u32(res_i2._4_4_,res_j0._4_4_,a_i,puStack_110);
      res_i._4_4_ = puStack_a8[local_e0 * 4 + 3];
      _a_i_1 = _i + (ulong)(local_e0 << 2) + 3;
      uStack_1f0 = 0x1de670;
      a_i = Hacl_Bignum_Base_mul_wide_add2_u32(res_i._4_4_,res_j0._4_4_,a_i,_a_i_1);
    }
    for (res_i_1._4_4_ = n_local._4_4_ & 0xfffffffc; res_i_1._4_4_ < n_local._4_4_;
        res_i_1._4_4_ = res_i_1._4_4_ + 1) {
      res_i_1._0_4_ = puStack_a8[res_i_1._4_4_];
      _c10_1 = _i + res_i_1._4_4_;
      uStack_1f0 = 0x1de6f9;
      a_i = Hacl_Bignum_Base_mul_wide_add2_u32((uint32_t)res_i_1,res_j0._4_4_,a_i,_c10_1);
    }
    resb._4_4_ = a_i;
    resb._0_4_ = a_i;
    _c00 = res_local + (ulong)n_local._4_4_ + (ulong)local_c8;
    local_144 = res_local[n_local._4_4_ + local_c8];
    local_81 = (char)qj;
    local_88 = a_i;
    *_c00 = a_i + local_144 + (uint)(local_81 != '\0');
    qj = (uint32_t)(CARRY4(a_i,local_144) || CARRY4(a_i + local_144,(uint)(local_81 != '\0')));
    puStack_98 = _c00;
    local_8c = local_144;
  }
  uStack_1f0 = 0x1de814;
  memcpy(_i0,res_local + n_local._4_4_,(ulong)n_local._4_4_ << 2);
  local_148 = qj;
  if (0x3fffffffffffffff < (ulong)n_local._4_4_) {
    uStack_1f0 = 0x1de84f;
    printf("Maximum allocatable size exceeded, aborting before overflow at %s:%d\n",
           "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/Hacl_Bignum.c"
           ,0x381);
    uStack_1f0 = 0x1de859;
    exit(0xfd);
  }
  _i_2 = (ulong)n_local._4_4_;
  lVar7 = -(_i_2 * 4 + 0xf & 0xfffffffffffffff0);
  uVar9 = (ulong)n_local._4_4_;
  local_1e0 = auStack_1e8 + lVar7;
  __vla_expr0 = (unsigned_long)auStack_1e8;
  *(undefined8 *)(auStack_1e8 + lVar7 + -8) = 0x1de8a1;
  memset(auStack_1e8 + lVar7,0,uVar9 << 2);
  t1 = 0;
  for (t20 = 0; puVar8 = local_1e0, t20 < n_local._4_4_ >> 2; t20 = t20 + 1) {
    uVar1 = _i0[t20 << 2];
    uVar2 = puStack_a8[t20 << 2];
    uVar5 = (uint)((char)t1 != '\0');
    uVar6 = uVar1 - uVar2;
    *(uint *)(local_1e0 + (ulong)(t20 << 2) * 4) = uVar6 - uVar5;
    uVar3 = _i0[t20 * 4 + 1];
    uVar4 = puStack_a8[t20 * 4 + 1];
    uVar5 = (uint)(uVar1 < uVar2 || uVar6 < uVar5);
    uVar6 = uVar3 - uVar4;
    *(uint *)(puVar8 + (ulong)(t20 << 2) * 4 + 4) = uVar6 - uVar5;
    uVar1 = _i0[t20 * 4 + 2];
    uVar2 = puStack_a8[t20 * 4 + 2];
    uVar5 = (uint)(uVar3 < uVar4 || uVar6 < uVar5);
    uVar6 = uVar1 - uVar2;
    *(uint *)(puVar8 + (ulong)(t20 << 2) * 4 + 8) = uVar6 - uVar5;
    uVar3 = _i0[t20 * 4 + 3];
    uVar4 = puStack_a8[t20 * 4 + 3];
    uVar1 = (uint)(uVar1 < uVar2 || uVar6 < uVar5);
    uVar2 = uVar3 - uVar4;
    *(uint *)(puVar8 + (ulong)(t20 << 2) * 4 + 0xc) = uVar2 - uVar1;
    t1 = (uint32_t)(uVar3 < uVar4 || uVar2 < uVar1);
  }
  for (t2_1 = n_local._4_4_ & 0xfffffffc; t2_1 < n_local._4_4_; t2_1 = t2_1 + 1) {
    uVar1 = _i0[t2_1];
    uVar2 = puStack_a8[t2_1];
    uVar3 = (uint)((char)t1 != '\0');
    uVar4 = uVar1 - uVar2;
    *(uint *)(local_1e0 + (ulong)t2_1 * 4) = uVar4 - uVar3;
    t1 = (uint32_t)(uVar1 < uVar2 || uVar4 < uVar3);
  }
  for (os._4_4_ = 0; os._4_4_ < n_local._4_4_; os._4_4_ = os._4_4_ + 1) {
    _i0[os._4_4_] =
         local_148 - t1 & _i0[os._4_4_] |
         (local_148 - t1 ^ 0xffffffff) & *(uint *)(local_1e0 + (ulong)os._4_4_ * 4);
  }
  return;
}

Assistant:

static void
bn_mont_reduction_u32(uint32_t len, uint32_t *n, uint32_t nInv, uint32_t *c, uint32_t *res)
{
  uint32_t c0 = 0U;
  for (uint32_t i0 = 0U; i0 < len; i0++)
  {
    uint32_t qj = nInv * c[i0];
    uint32_t *res_j0 = c + i0;
    uint32_t c1 = 0U;
    for (uint32_t i = 0U; i < len / 4U; i++)
    {
      uint32_t a_i = n[4U * i];
      uint32_t *res_i0 = res_j0 + 4U * i;
      c1 = Hacl_Bignum_Base_mul_wide_add2_u32(a_i, qj, c1, res_i0);
      uint32_t a_i0 = n[4U * i + 1U];
      uint32_t *res_i1 = res_j0 + 4U * i + 1U;
      c1 = Hacl_Bignum_Base_mul_wide_add2_u32(a_i0, qj, c1, res_i1);
      uint32_t a_i1 = n[4U * i + 2U];
      uint32_t *res_i2 = res_j0 + 4U * i + 2U;
      c1 = Hacl_Bignum_Base_mul_wide_add2_u32(a_i1, qj, c1, res_i2);
      uint32_t a_i2 = n[4U * i + 3U];
      uint32_t *res_i = res_j0 + 4U * i + 3U;
      c1 = Hacl_Bignum_Base_mul_wide_add2_u32(a_i2, qj, c1, res_i);
    }
    for (uint32_t i = len / 4U * 4U; i < len; i++)
    {
      uint32_t a_i = n[i];
      uint32_t *res_i = res_j0 + i;
      c1 = Hacl_Bignum_Base_mul_wide_add2_u32(a_i, qj, c1, res_i);
    }
    uint32_t r = c1;
    uint32_t c10 = r;
    uint32_t *resb = c + len + i0;
    uint32_t res_j = c[len + i0];
    c0 = Lib_IntTypes_Intrinsics_add_carry_u32(c0, c10, res_j, resb);
  }
  memcpy(res, c + len, (len + len - len) * sizeof (uint32_t));
  uint32_t c00 = c0;
  KRML_CHECK_SIZE(sizeof (uint32_t), len);
  uint32_t tmp[len];
  memset(tmp, 0U, len * sizeof (uint32_t));
  uint32_t c1 = 0U;
  for (uint32_t i = 0U; i < len / 4U; i++)
  {
    uint32_t t1 = res[4U * i];
    uint32_t t20 = n[4U * i];
    uint32_t *res_i0 = tmp + 4U * i;
    c1 = Lib_IntTypes_Intrinsics_sub_borrow_u32(c1, t1, t20, res_i0);
    uint32_t t10 = res[4U * i + 1U];
    uint32_t t21 = n[4U * i + 1U];
    uint32_t *res_i1 = tmp + 4U * i + 1U;
    c1 = Lib_IntTypes_Intrinsics_sub_borrow_u32(c1, t10, t21, res_i1);
    uint32_t t11 = res[4U * i + 2U];
    uint32_t t22 = n[4U * i + 2U];
    uint32_t *res_i2 = tmp + 4U * i + 2U;
    c1 = Lib_IntTypes_Intrinsics_sub_borrow_u32(c1, t11, t22, res_i2);
    uint32_t t12 = res[4U * i + 3U];
    uint32_t t2 = n[4U * i + 3U];
    uint32_t *res_i = tmp + 4U * i + 3U;
    c1 = Lib_IntTypes_Intrinsics_sub_borrow_u32(c1, t12, t2, res_i);
  }
  for (uint32_t i = len / 4U * 4U; i < len; i++)
  {
    uint32_t t1 = res[i];
    uint32_t t2 = n[i];
    uint32_t *res_i = tmp + i;
    c1 = Lib_IntTypes_Intrinsics_sub_borrow_u32(c1, t1, t2, res_i);
  }
  uint32_t c10 = c1;
  uint32_t c2 = c00 - c10;
  for (uint32_t i = 0U; i < len; i++)
  {
    uint32_t *os = res;
    uint32_t x = (c2 & res[i]) | (~c2 & tmp[i]);
    os[i] = x;
  }
}